

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::Coap::ResponsesCache::ResponsesCache
          (ResponsesCache *this,event_base *aEventBase,Duration *aLifetime)

{
  _Rb_tree_header *p_Var1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  (this->mLifetime).__r = aLifetime->__r;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(ot::commissioner::Timer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.hpp:725:34)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(ot::commissioner::Timer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.hpp:725:34)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  Timer::Timer(&this->mTimer,aEventBase,(Action *)&local_28,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  p_Var1 = &(this->mContainer)._M_t._M_impl.super__Rb_tree_header;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

explicit ResponsesCache(struct event_base *aEventBase, const Duration &aLifetime)
            : mLifetime(aLifetime)
            , mTimer(aEventBase, [this](Timer &) { Eliminate(); })
        {
        }